

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O0

void ngx_slab_free_pages(ngx_slab_pool_t *pool,ngx_slab_page_t *page,ngx_uint_t pages)

{
  ngx_slab_page_t *pnVar1;
  ngx_slab_page_t *local_30;
  ngx_slab_page_t *join;
  ngx_slab_page_t *prev;
  ngx_uint_t pages_local;
  ngx_slab_page_t *page_local;
  ngx_slab_pool_t *pool_local;
  
  pool->pfree = pages + pool->pfree;
  prev = (ngx_slab_page_t *)(pages - 1);
  page->slab = pages;
  if (prev != (ngx_slab_page_t *)0x0) {
    memset(page + 1,0,(long)prev * 0x18);
  }
  if (page->next != (ngx_slab_page_t *)0x0) {
    *(ngx_slab_page_t **)((page->prev & 0xfffffffffffffffc) + 8) = page->next;
    page->next->prev = page->prev;
  }
  pnVar1 = page + page->slab;
  if (((pnVar1 < pool->last) && ((pnVar1->prev & 3) == 0)) &&
     (pnVar1->next != (ngx_slab_page_t *)0x0)) {
    prev = (ngx_slab_page_t *)((long)&prev->slab + pnVar1->slab);
    page->slab = pnVar1->slab + page->slab;
    *(ngx_slab_page_t **)((pnVar1->prev & 0xfffffffffffffffc) + 8) = pnVar1->next;
    pnVar1->next->prev = pnVar1->prev;
    pnVar1->slab = 0;
    pnVar1->next = (ngx_slab_page_t *)0x0;
    pnVar1->prev = 0;
  }
  pages_local = (ngx_uint_t)page;
  if ((pool->pages < page) && (local_30 = page + -1, (page[-1].prev & 3) == 0)) {
    if (local_30->slab == 0) {
      local_30 = (ngx_slab_page_t *)(page[-1].prev & 0xfffffffffffffffc);
    }
    if (local_30->next != (ngx_slab_page_t *)0x0) {
      prev = (ngx_slab_page_t *)((long)&prev->slab + local_30->slab);
      local_30->slab = page->slab + local_30->slab;
      *(ngx_slab_page_t **)((local_30->prev & 0xfffffffffffffffc) + 8) = local_30->next;
      local_30->next->prev = local_30->prev;
      page->slab = 0;
      page->next = (ngx_slab_page_t *)0x0;
      page->prev = 0;
      pages_local = (ngx_uint_t)local_30;
    }
  }
  if (prev != (ngx_slab_page_t *)0x0) {
    *(ngx_uint_t *)(pages_local + (long)prev * 0x18 + 0x10) = pages_local;
  }
  *(ngx_slab_page_t **)(pages_local + 0x10) = &pool->free;
  *(ngx_slab_page_t **)(pages_local + 8) = (pool->free).next;
  *(ngx_uint_t *)(*(long *)(pages_local + 8) + 0x10) = pages_local;
  (pool->free).next = (ngx_slab_page_t *)pages_local;
  return;
}

Assistant:

static void
ngx_slab_free_pages(ngx_slab_pool_t *pool, ngx_slab_page_t *page,
    ngx_uint_t pages)
{
    ngx_slab_page_t  *prev, *join;

    pool->pfree += pages;

    page->slab = pages--;

    if (pages) {
        ngx_memzero(&page[1], pages * sizeof(ngx_slab_page_t));
    }

    if (page->next) {
        prev = ngx_slab_page_prev(page);
        prev->next = page->next;
        page->next->prev = page->prev;
    }

    join = page + page->slab;

    if (join < pool->last) {

        if (ngx_slab_page_type(join) == NGX_SLAB_PAGE) {

            if (join->next != NULL) {
                pages += join->slab;
                page->slab += join->slab;

                prev = ngx_slab_page_prev(join);
                prev->next = join->next;
                join->next->prev = join->prev;

                join->slab = NGX_SLAB_PAGE_FREE;
                join->next = NULL;
                join->prev = NGX_SLAB_PAGE;
            }
        }
    }

    if (page > pool->pages) {
        join = page - 1;

        if (ngx_slab_page_type(join) == NGX_SLAB_PAGE) {

            if (join->slab == NGX_SLAB_PAGE_FREE) {
                join = ngx_slab_page_prev(join);
            }

            if (join->next != NULL) {
                pages += join->slab;
                join->slab += page->slab;

                prev = ngx_slab_page_prev(join);
                prev->next = join->next;
                join->next->prev = join->prev;

                page->slab = NGX_SLAB_PAGE_FREE;
                page->next = NULL;
                page->prev = NGX_SLAB_PAGE;

                page = join;
            }
        }
    }

    if (pages) {
        page[pages].prev = (uintptr_t) page;
    }

    page->prev = (uintptr_t) &pool->free;
    page->next = pool->free.next;

    page->next->prev = (uintptr_t) page;

    pool->free.next = page;
}